

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

mbedtls_ssl_ciphersuite_t * mbedtls_ssl_ciphersuite_from_id(int ciphersuite)

{
  mbedtls_ssl_ciphersuite_t *local_20;
  mbedtls_ssl_ciphersuite_t *cur;
  int ciphersuite_local;
  
  local_20 = ciphersuite_definitions;
  while( true ) {
    if (local_20->id == 0) {
      return (mbedtls_ssl_ciphersuite_t *)0x0;
    }
    if (local_20->id == ciphersuite) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

const mbedtls_ssl_ciphersuite_t *mbedtls_ssl_ciphersuite_from_id(int ciphersuite)
{
    const mbedtls_ssl_ciphersuite_t *cur = ciphersuite_definitions;

    while (cur->id != 0) {
        if (cur->id == ciphersuite) {
            return cur;
        }

        cur++;
    }

    return NULL;
}